

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

WildcardImportSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  WildcardImportSymbol *pWVar4;
  
  pWVar4 = (WildcardImportSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WildcardImportSymbol *)this->endPtr < pWVar4 + 1) {
    pWVar4 = (WildcardImportSymbol *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pWVar4 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (pWVar4->super_Symbol).kind = WildcardImport;
  (pWVar4->super_Symbol).name._M_len = 0;
  (pWVar4->super_Symbol).name._M_str = "";
  (pWVar4->super_Symbol).location = SVar1;
  (pWVar4->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pWVar4->super_Symbol).parentScope = (Scope *)0x0;
  (pWVar4->super_Symbol).nextInScope = (Symbol *)0x0;
  (pWVar4->super_Symbol).indexInScope = 0;
  (pWVar4->packageName)._M_len = sVar2;
  (pWVar4->packageName)._M_str = pcVar3;
  pWVar4->isFromExport = false;
  (pWVar4->package).super__Optional_base<const_slang::ast::PackageSymbol_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::PackageSymbol_*>._M_engaged = false;
  return pWVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }